

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O1

IntrinsicResult intrinsic_basename(Context *context,IntrinsicResult partialResult)

{
  long *plVar1;
  TextOutputMethod *pp_Var2;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar3;
  undefined4 *puVar4;
  char *__path;
  char *__s;
  size_t sVar5;
  anon_union_8_3_2f476f46_for_data aVar6;
  _func_int **__s_00;
  TextOutputMethod __s_01;
  ulong __n;
  Value path;
  String pathStr;
  Value local_80;
  Value local_70;
  undefined1 local_60 [16];
  Interpreter *local_50;
  anon_union_8_3_2f476f46_for_data local_48;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_40;
  anon_union_8_3_2f476f46_for_data local_38;
  
  local_38.tempNum._0_1_ = false;
  pDVar3 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)operator_new(0x30);
  (pDVar3->super_RefCountedStorage).refCount = 1;
  (pDVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
       (_func_int **)&PTR__StringStorage_001d10b0;
  pDVar3->mTable[0] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x5;
  pDVar3->mTable[1] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0xffffffffffffffff;
  puVar4 = (undefined4 *)operator_new__(5);
  pDVar3->mSize = (long)puVar4;
  *(undefined1 *)(puVar4 + 1) = 0;
  *puVar4 = 0x68746170;
  local_40 = pDVar3;
  MiniScript::Context::GetVar
            ((Context *)local_60,(String *)partialResult.rs,(LocalOnlyMode)&local_40);
  if ((local_40 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
     ((bool)local_38.tempNum._0_1_ == false)) {
    plVar1 = &(local_40->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_40->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_40 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
  }
  if (local_60[0] == 0) {
    local_80.type = MiniScript::Value::zero;
    local_80.noInvoke = DAT_001d32e1;
    local_80.localOnly = DAT_001d32e2;
    local_80.data.ref = DAT_001d32e8;
    if ((Temp < MiniScript::Value::zero) && (DAT_001d32e8 != (RefCountedStorage *)0x0)) {
      DAT_001d32e8->refCount = DAT_001d32e8->refCount + 1;
    }
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    MiniScript::Value::operator=
              ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
               &local_80);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((Temp < local_80.type) && (local_80.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_80.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_80.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_80.data.number = 0.0;
    }
  }
  else {
    MiniScript::Value::ToString((Value *)&local_50,(Machine *)local_60);
    if (local_50 == (Interpreter *)0x0) {
      __s_01 = (TextOutputMethod)0x1a780e;
    }
    else {
      __s_01 = local_50->implicitOutput;
    }
    __path = strdup((char *)__s_01);
    __s = __xpg_basename(__path);
    if (__s == (char *)0x0) {
      sVar5 = 0;
    }
    else {
      sVar5 = strlen(__s);
    }
    if (sVar5 == 0) {
      aVar6.number = 0.0;
    }
    else {
      aVar6.ref = (RefCountedStorage *)operator_new(0x30);
      __n = sVar5 + 1;
      (aVar6.ref)->refCount = 1;
      (aVar6.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
      aVar6.ref[1].refCount = __n;
      aVar6.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
      __s_00 = (_func_int **)operator_new__(__n);
      aVar6.ref[1]._vptr_RefCountedStorage = __s_00;
      memset(__s_00,0,__n);
      memcpy(__s_00,__s,__n);
    }
    free(__path);
    local_70.type = String;
    local_70.noInvoke = false;
    local_70.localOnly = Off;
    local_70.data = aVar6;
    if (aVar6.ref == (RefCountedStorage *)0x0) {
      local_70.data = DAT_001d3308;
    }
    if (local_70.data.ref != (RefCountedStorage *)0x0) {
      (local_70.data.ref)->refCount = (local_70.data.ref)->refCount + 1;
    }
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    MiniScript::Value::operator=
              ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
               &local_70);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((Temp < local_70.type) && (local_70.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_70.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_70.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_70.data.number = 0.0;
    }
    if (aVar6.ref != (RefCountedStorage *)0x0) {
      plVar1 = &(aVar6.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(aVar6.ref)->_vptr_RefCountedStorage[1])(aVar6.number);
      }
    }
    if ((local_50 != (Interpreter *)0x0) && (local_48.tempNum._0_1_ == '\0')) {
      pp_Var2 = &local_50->standardOutput;
      *pp_Var2 = *pp_Var2 + -1;
      if (*pp_Var2 == (TextOutputMethod)0x0) {
        (*local_50->_vptr_Interpreter[1])();
      }
      local_50 = (Interpreter *)0x0;
    }
  }
  if ((2 < local_60[0]) && ((long *)local_60._8_8_ != (long *)0x0)) {
    plVar1 = (long *)(local_60._8_8_ + 8);
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (**(code **)(*(long *)local_60._8_8_ + 8))();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_basename(Context *context, IntrinsicResult partialResult) {
	Value path = context->GetVar("path");
	if (path.IsNull()) return IntrinsicResult(Value::zero);
	String pathStr = path.ToString();
	#if _WIN32 || _WIN64
		char driveBuf[3];
		char nameBuf[256];
		char extBuf[256];
		_splitpath_s(pathStr.c_str(), driveBuf, sizeof(driveBuf), nullptr, 0, nameBuf, sizeof(nameBuf), extBuf, sizeof(extBuf));
		String result = String(nameBuf) + String(extBuf);
	#elif defined(__APPLE__) || defined(__FreeBSD__)
		String result(basename((char*)pathStr.c_str()));
	#else
		char *duplicate = strdup((char*)pathStr.c_str());
		String result(basename(duplicate));
		free(duplicate);
	#endif
	return IntrinsicResult(result);
}